

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

exr_result_t exr_attr_string_init_static(exr_context_t ctxt,exr_attr_string_t *s,char *v)

{
  exr_result_t eVar1;
  size_t sVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  
  if (v == (char *)0x0) {
    if (ctxt == (exr_context_t)0x0) {
      return 2;
    }
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar3 = "Invalid static string argument to initialize";
  }
  else {
    sVar2 = strlen(v);
    if (sVar2 < 0x7fffffff) {
      eVar1 = exr_attr_string_init_static_with_length(ctxt,s,v,(int32_t)sVar2);
      return eVar1;
    }
    if (ctxt == (exr_context_t)0x0) {
      return 2;
    }
    UNRECOVERED_JUMPTABLE = ctxt->report_error;
    pcVar3 = "Invalid string too long for attribute";
  }
  eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar3);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_init_static (
    exr_context_t ctxt, exr_attr_string_t* s, const char* v)
{
    size_t  fulllen = 0;
    int32_t length  = 0;

    if (v)
    {
        fulllen = strlen (v);
        if (fulllen >= (size_t) INT32_MAX)
        {
            if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
            return ctxt->report_error (
                ctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid string too long for attribute");
        }
        length = (int32_t) fulllen;
    }
    return exr_attr_string_init_static_with_length (ctxt, s, v, length);
}